

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_config(lyout *out,uint16_t flags,int *first)

{
  char *local_28;
  char *str;
  int *first_local;
  uint16_t flags_local;
  lyout *out_local;
  
  local_28 = (char *)0x0;
  if ((flags & 3) != 0) {
    if ((flags & 2) == 0) {
      if ((flags & 1) != 0) {
        local_28 = "true";
      }
    }
    else {
      local_28 = "false";
    }
    jsons_print_object(out,"config","value",local_28,1,first);
  }
  return;
}

Assistant:

static void
jsons_print_config(struct lyout *out, uint16_t flags, int *first)
{
    const char *str = NULL;

    if (flags & LYS_CONFIG_MASK) {
        if (flags & LYS_CONFIG_R) {
            str = "false";
        } else if (flags & LYS_CONFIG_W) {
            str = "true";
        }
        jsons_print_object(out, "config", "value", str, 1, first);
    }
}